

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglPreservingSwapTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::anon_unknown_4::GLES2Program::GLES2Program(GLES2Program *this,Functions *gl)

{
  glGetAttribLocationFunc p_Var1;
  Functions *gl_00;
  deUint32 dVar2;
  GLint GVar3;
  ProgramSources local_e8;
  Functions *local_18;
  Functions *gl_local;
  GLES2Program *this_local;
  
  local_18 = gl;
  gl_local = (Functions *)this;
  Program::Program(&this->super_Program);
  gl_00 = local_18;
  (this->super_Program)._vptr_Program = (_func_int **)&PTR__GLES2Program_00676fe0;
  this->m_gl = local_18;
  getProgramSourcesES2();
  glu::ShaderProgram::ShaderProgram(&this->m_program,gl_00,&local_e8);
  glu::ProgramSources::~ProgramSources(&local_e8);
  this->m_positionLoc = 0;
  this->m_colorLoc = 0;
  p_Var1 = this->m_gl->getAttribLocation;
  dVar2 = glu::ShaderProgram::getProgram(&this->m_program);
  GVar3 = (*p_Var1)(dVar2,"a_position");
  this->m_positionLoc = GVar3;
  p_Var1 = this->m_gl->getAttribLocation;
  dVar2 = glu::ShaderProgram::getProgram(&this->m_program);
  GVar3 = (*p_Var1)(dVar2,"a_color");
  this->m_colorLoc = GVar3;
  return;
}

Assistant:

GLES2Program::GLES2Program (const glw::Functions& gl)
	: m_gl			(gl)
	, m_glProgram	(gl, getSources())
	, m_coordLoc	((glw::GLuint)-1)
	, m_colorLoc	((glw::GLuint)-1)
{
	m_colorLoc = m_gl.getAttribLocation(m_glProgram.getProgram(), "a_color");
	m_coordLoc = m_gl.getAttribLocation(m_glProgram.getProgram(), "a_pos");
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "Failed to get attribute locations");
}